

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xeTestCaseResult.hpp
# Opt level: O0

void __thiscall xe::ri::ShaderProgram::ShaderProgram(ShaderProgram *this)

{
  ShaderProgram *this_local;
  
  Item::Item(&this->super_Item,TYPE_SHADERPROGRAM);
  (this->super_Item)._vptr_Item = (_func_int **)&PTR__ShaderProgram_0017a798;
  List::List(&this->shaders);
  this->linkStatus = false;
  InfoLog::InfoLog(&this->linkInfoLog);
  return;
}

Assistant:

ShaderProgram		(void) : Item(TYPE_SHADERPROGRAM), linkStatus(false) {}